

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_side_node(REF_NODE ref_node)

{
  uint uVar1;
  double dVar2;
  double local_58;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL hh;
  REF_DBL h;
  REF_DBL h0;
  REF_INT node;
  REF_NODE ref_node_local;
  
  h0._4_4_ = 0;
  do {
    if (ref_node->max <= h0._4_4_) {
      return 0;
    }
    if (((-1 < h0._4_4_) && (h0._4_4_ < ref_node->max)) && (-1 < ref_node->global[h0._4_4_])) {
      if (ref_node->real[h0._4_4_ * 0xf + 2] <= 0.0) {
        local_58 = -ref_node->real[h0._4_4_ * 0xf + 2];
      }
      else {
        local_58 = ref_node->real[h0._4_4_ * 0xf + 2];
      }
      dVar2 = local_58 * 0.09000000000000001 + 0.01;
      uVar1 = ref_node_metric_form
                        (ref_node,h0._4_4_,99.99999999999999,0.0,0.0,99.99999999999999,0.0,
                         1.0 / (dVar2 * dVar2));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x68,"ref_metric_side_node",(ulong)uVar1,"set node met");
        return uVar1;
      }
    }
    h0._4_4_ = h0._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_side_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL h0 = 0.1;
  REF_DBL h = 0.01;
  REF_DBL hh;

  each_ref_node_valid_node(ref_node, node) {
    hh = h + (h0 - h) * ABS(ref_node_xyz(ref_node, 2, node));
    RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                             1.0 / (0.1 * 0.1), 0, 1.0 / (hh * hh)),
        "set node met");
  }

  return REF_SUCCESS;
}